

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPolyhedron.cpp
# Opt level: O3

void __thiscall cbtConvexPolyhedron::initialize(cbtConvexPolyhedron *this)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  short sVar6;
  cbtVector3 *ptr;
  float fVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  short tmp;
  int iVar11;
  uint uVar12;
  cbtVector3 *pcVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  cbtInternalEdge *pcVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  cbtInternalVertexPair vp;
  cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge> edges;
  cbtInternalVertexPair local_f0;
  cbtInternalEdge local_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  long local_c8;
  ulong local_c0;
  long local_b8;
  cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge> local_b0;
  
  local_b0.m_hashTable.m_ownsMemory = true;
  local_b0.m_hashTable.m_data = (int *)0x0;
  local_b0.m_hashTable.m_size = 0;
  local_b0.m_hashTable.m_capacity = 0;
  local_b0.m_next.m_ownsMemory = true;
  local_b0.m_next.m_data = (int *)0x0;
  local_b0.m_next.m_size = 0;
  local_b0.m_next.m_capacity = 0;
  local_b0.m_valueArray.m_ownsMemory = true;
  local_b0.m_valueArray.m_data = (cbtInternalEdge *)0x0;
  local_b0.m_valueArray.m_size = 0;
  local_b0.m_valueArray.m_capacity = 0;
  local_b0.m_keyArray.m_ownsMemory = true;
  local_b0.m_keyArray.m_data = (cbtInternalVertexPair *)0x0;
  local_b0.m_keyArray.m_size = 0;
  local_b0.m_keyArray.m_capacity = 0;
  iVar11 = (this->m_faces).m_size;
  if (0 < iVar11) {
    lVar14 = 0;
    do {
      local_b8 = lVar14 * 0x30;
      uVar16 = (ulong)(this->m_faces).m_data[lVar14].m_indices.m_size;
      if (0 < (long)uVar16) {
        uVar18 = 0;
        local_c8 = lVar14;
        local_c0 = uVar16;
        do {
          lVar15 = *(long *)((long)((this->m_faces).m_data)->m_plane + local_b8 + -0x10);
          sVar6 = *(short *)(lVar15 + uVar18 * 4);
          uVar18 = uVar18 + 1;
          uVar16 = 0;
          if (uVar18 != local_c0) {
            uVar16 = uVar18 & 0xffffffff;
          }
          local_f0.m_v1 = *(short *)(lVar15 + uVar16 * 4);
          local_f0.m_v0 = sVar6;
          if (sVar6 < local_f0.m_v1) {
            local_f0.m_v0 = local_f0.m_v1;
            local_f0.m_v1 = sVar6;
          }
          iVar11 = cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::findIndex
                             (&local_b0,&local_f0);
          pcVar13 = (this->m_vertices).m_data;
          pcVar17 = (cbtInternalEdge *)0x0;
          if (iVar11 != -1) {
            pcVar17 = local_b0.m_valueArray.m_data + iVar11;
          }
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)pcVar13[local_f0.m_v1].m_floats;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)pcVar13[local_f0.m_v0].m_floats;
          uVar12 = (this->m_uniqueEdges).m_size;
          fVar7 = pcVar13[local_f0.m_v1].m_floats[2] - pcVar13[local_f0.m_v0].m_floats[2];
          auVar22 = vsubps_avx(auVar20,auVar22);
          local_e8 = auVar22._0_4_;
          auVar23._0_4_ = local_e8 * local_e8;
          fStack_e4 = auVar22._4_4_;
          auVar23._4_4_ = fStack_e4 * fStack_e4;
          fStack_e0 = auVar22._8_4_;
          auVar23._8_4_ = fStack_e0 * fStack_e0;
          fStack_dc = auVar22._12_4_;
          auVar23._12_4_ = fStack_dc * fStack_dc;
          auVar20 = vmovshdup_avx(auVar23);
          auVar20 = vfmadd231ss_fma(auVar20,auVar22,auVar22);
          auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
          auVar20 = vsqrtss_avx(auVar20,auVar20);
          fVar21 = 1.0 / auVar20._0_4_;
          fVar7 = fVar7 * fVar21;
          local_e8 = local_e8 * fVar21;
          fStack_e4 = fStack_e4 * fVar21;
          fStack_e0 = fStack_e0 * fVar21;
          fStack_dc = fStack_dc * fVar21;
          local_d8 = ZEXT416((uint)fVar7);
          if (0 < (long)(int)uVar12) {
            auVar9._4_4_ = fStack_e4;
            auVar9._0_4_ = local_e8;
            auVar9._8_4_ = fStack_e0;
            auVar9._12_4_ = fStack_dc;
            auVar20 = vmovshdup_avx(auVar9);
            pcVar13 = (this->m_uniqueEdges).m_data;
            lVar15 = 0;
            do {
              fVar21 = *(float *)((long)pcVar13->m_floats + lVar15);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              fVar4 = *(float *)((long)pcVar13->m_floats + lVar15 + 4);
              fVar5 = *(float *)((long)pcVar13->m_floats + lVar15 + 8);
              auVar22 = vandps_avx(ZEXT416((uint)(fVar21 - local_e8)),auVar24);
              if ((((auVar22._0_4_ <= 1e-06) &&
                   (auVar22 = vandps_avx(ZEXT416((uint)(fVar4 - auVar20._0_4_)),auVar24),
                   auVar22._0_4_ <= 1e-06)) &&
                  (auVar22 = vandps_avx(ZEXT416((uint)(fVar5 - fVar7)),auVar24),
                  auVar22._0_4_ <= 1e-06)) ||
                 (((auVar22 = vandps_avx(ZEXT416((uint)(fVar21 + local_e8)),auVar24),
                   auVar22._0_4_ <= 1e-06 &&
                   (auVar22 = vandps_avx(ZEXT416((uint)(auVar20._0_4_ + fVar4)),auVar24),
                   auVar22._0_4_ <= 1e-06)) &&
                  (auVar22 = vandps_avx(ZEXT416((uint)(fVar5 + fVar7)),auVar24),
                  auVar22._0_4_ <= 1e-06)))) goto LAB_008dbc7f;
              lVar15 = lVar15 + 0x10;
            } while ((long)(int)uVar12 << 4 != lVar15);
          }
          if (uVar12 == (this->m_uniqueEdges).m_capacity) {
            iVar11 = uVar12 * 2;
            if (uVar12 == 0) {
              iVar11 = 1;
            }
            if ((int)uVar12 < iVar11) {
              if (iVar11 == 0) {
                pcVar13 = (cbtVector3 *)0x0;
              }
              else {
                pcVar13 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar11 << 4,0x10);
                uVar12 = (this->m_uniqueEdges).m_size;
              }
              if (0 < (int)uVar12) {
                lVar14 = 0;
                do {
                  puVar2 = (undefined8 *)((long)((this->m_uniqueEdges).m_data)->m_floats + lVar14);
                  uVar8 = puVar2[1];
                  puVar3 = (undefined8 *)((long)pcVar13->m_floats + lVar14);
                  *puVar3 = *puVar2;
                  puVar3[1] = uVar8;
                  lVar14 = lVar14 + 0x10;
                } while ((ulong)uVar12 << 4 != lVar14);
              }
              ptr = (this->m_uniqueEdges).m_data;
              if ((ptr != (cbtVector3 *)0x0) && ((this->m_uniqueEdges).m_ownsMemory == true)) {
                cbtAlignedFreeInternal(ptr);
              }
              (this->m_uniqueEdges).m_ownsMemory = true;
              (this->m_uniqueEdges).m_data = pcVar13;
              (this->m_uniqueEdges).m_capacity = iVar11;
              uVar12 = (this->m_uniqueEdges).m_size;
              lVar14 = local_c8;
            }
          }
          auVar10._4_4_ = fStack_e4;
          auVar10._0_4_ = local_e8;
          auVar10._8_4_ = fStack_e0;
          auVar10._12_4_ = fStack_dc;
          auVar19._4_8_ = SUB128(ZEXT812(0),4);
          auVar19._0_4_ = local_d8._0_4_;
          auVar19._12_4_ = 0;
          auVar20 = vmovlhps_avx(auVar10,auVar19);
          *(undefined1 (*) [16])(this->m_uniqueEdges).m_data[(int)uVar12].m_floats = auVar20;
          piVar1 = &(this->m_uniqueEdges).m_size;
          *piVar1 = *piVar1 + 1;
LAB_008dbc7f:
          if (pcVar17 == (cbtInternalEdge *)0x0) {
            local_ec.m_face1 = -1;
            local_ec.m_face0 = (short)lVar14;
            cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::insert
                      (&local_b0,&local_f0,&local_ec);
          }
          else {
            pcVar17->m_face1 = (short)lVar14;
          }
        } while (uVar18 != local_c0);
        iVar11 = (this->m_faces).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar11);
  }
  initialize2(this);
  cbtAlignedObjectArray<cbtInternalVertexPair>::~cbtAlignedObjectArray(&local_b0.m_keyArray);
  cbtAlignedObjectArray<cbtInternalEdge>::~cbtAlignedObjectArray(&local_b0.m_valueArray);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_b0.m_next);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_b0.m_hashTable);
  return;
}

Assistant:

void cbtConvexPolyhedron::initialize()
{
	cbtHashMap<cbtInternalVertexPair, cbtInternalEdge> edges;

	for (int i = 0; i < m_faces.size(); i++)
	{
		int numVertices = m_faces[i].m_indices.size();
		int NbTris = numVertices;
		for (int j = 0; j < NbTris; j++)
		{
			int k = (j + 1) % numVertices;
			cbtInternalVertexPair vp(m_faces[i].m_indices[j], m_faces[i].m_indices[k]);
			cbtInternalEdge* edptr = edges.find(vp);
			cbtVector3 edge = m_vertices[vp.m_v1] - m_vertices[vp.m_v0];
			edge.normalize();

			bool found = false;

			for (int p = 0; p < m_uniqueEdges.size(); p++)
			{
				if (IsAlmostZero1(m_uniqueEdges[p] - edge) ||
					IsAlmostZero1(m_uniqueEdges[p] + edge))
				{
					found = true;
					break;
				}
			}

			if (!found)
			{
				m_uniqueEdges.push_back(edge);
			}

			if (edptr)
			{
				cbtAssert(edptr->m_face0 >= 0);
				cbtAssert(edptr->m_face1 < 0);
				edptr->m_face1 = i;
			}
			else
			{
				cbtInternalEdge ed;
				ed.m_face0 = i;
				edges.insert(vp, ed);
			}
		}
	}

#ifdef USE_CONNECTED_FACES
	for (int i = 0; i < m_faces.size(); i++)
	{
		int numVertices = m_faces[i].m_indices.size();
		m_faces[i].m_connectedFaces.resize(numVertices);

		for (int j = 0; j < numVertices; j++)
		{
			int k = (j + 1) % numVertices;
			cbtInternalVertexPair vp(m_faces[i].m_indices[j], m_faces[i].m_indices[k]);
			cbtInternalEdge* edptr = edges.find(vp);
			cbtAssert(edptr);
			cbtAssert(edptr->m_face0 >= 0);
			cbtAssert(edptr->m_face1 >= 0);

			int connectedFace = (edptr->m_face0 == i) ? edptr->m_face1 : edptr->m_face0;
			m_faces[i].m_connectedFaces[j] = connectedFace;
		}
	}
#endif  //USE_CONNECTED_FACES

	initialize2();
}